

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

Vec2 __thiscall
tcu::computeCubeLodBoundsFromDerivates
          (tcu *this,Vec3 *coord,Vec3 *coordDx,Vec3 *coordDy,int faceSize,LodPrecision *prec)

{
  CubeFace CVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  Vec2 VVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  CVar1 = selectCubeFace(coord);
  if (CVar1 < CUBEFACE_LAST) {
    uVar4 = (ulong)CVar1;
    lVar2 = *(long *)(&DAT_01d17030 + uVar4 * 8);
    lVar3 = *(long *)(&DAT_01d17060 + uVar4 * 8);
    lVar5 = *(long *)(&DAT_01d17090 + uVar4 * 8);
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    lVar5 = 0;
  }
  fVar11 = coord->m_data[lVar5];
  fVar8 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar8 = fVar11;
  }
  fVar11 = coordDx->m_data[lVar5];
  fVar7 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar7 = fVar11;
  }
  fVar11 = coordDy->m_data[lVar5];
  fVar10 = (float)faceSize * 0.5;
  fVar9 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar9 = fVar11;
  }
  fVar11 = fVar8 * fVar8;
  VVar6 = computeLodBoundsFromDerivates
                    (this,((coordDx->m_data[lVar3] * fVar8 - fVar7 * coord->m_data[lVar3]) * fVar10)
                          / fVar11,
                     ((coordDx->m_data[lVar2] * fVar8 - fVar7 * coord->m_data[lVar2]) * fVar10) /
                     fVar11,0.0,
                     ((coordDy->m_data[lVar3] * fVar8 - coord->m_data[lVar3] * fVar9) * fVar10) /
                     fVar11,((fVar8 * coordDy->m_data[lVar2] - fVar9 * coord->m_data[lVar2]) *
                            fVar10) / fVar11,0.0,prec);
  return (Vec2)VVar6.m_data;
}

Assistant:

Vec2 computeCubeLodBoundsFromDerivates (const Vec3& coord, const Vec3& coordDx, const Vec3& coordDy, const int faceSize, const LodPrecision& prec)
{
	const bool			allowBrokenEdgeDerivate		= false;
	const CubeFace		face						= selectCubeFace(coord);
	int					maNdx						= 0;
	int					sNdx						= 0;
	int					tNdx						= 0;

	// \note Derivate signs don't matter when computing lod
	switch (face)
	{
		case CUBEFACE_NEGATIVE_X:
		case CUBEFACE_POSITIVE_X: maNdx = 0; sNdx = 2; tNdx = 1; break;
		case CUBEFACE_NEGATIVE_Y:
		case CUBEFACE_POSITIVE_Y: maNdx = 1; sNdx = 0; tNdx = 2; break;
		case CUBEFACE_NEGATIVE_Z:
		case CUBEFACE_POSITIVE_Z: maNdx = 2; sNdx = 0; tNdx = 1; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	{
		const float		sc		= coord[sNdx];
		const float		tc		= coord[tNdx];
		const float		ma		= de::abs(coord[maNdx]);
		const float		scdx	= coordDx[sNdx];
		const float		tcdx	= coordDx[tNdx];
		const float		madx	= de::abs(coordDx[maNdx]);
		const float		scdy	= coordDy[sNdx];
		const float		tcdy	= coordDy[tNdx];
		const float		mady	= de::abs(coordDy[maNdx]);
		const float		dudx	= float(faceSize) * 0.5f * (scdx*ma - sc*madx) / (ma*ma);
		const float		dvdx	= float(faceSize) * 0.5f * (tcdx*ma - tc*madx) / (ma*ma);
		const float		dudy	= float(faceSize) * 0.5f * (scdy*ma - sc*mady) / (ma*ma);
		const float		dvdy	= float(faceSize) * 0.5f * (tcdy*ma - tc*mady) / (ma*ma);
		const Vec2		bounds	= computeLodBoundsFromDerivates(dudx, dvdx, dudy, dvdy, prec);

		// Implementations may compute derivate from projected (s, t) resulting in incorrect values at edges.
		if (allowBrokenEdgeDerivate)
		{
			const Vec3			dxErr		= computeFloatingPointError(coordDx, IVec3(prec.derivateBits));
			const Vec3			dyErr		= computeFloatingPointError(coordDy, IVec3(prec.derivateBits));
			const Vec3			xoffs		= abs(coordDx) + dxErr;
			const Vec3			yoffs		= abs(coordDy) + dyErr;

			if (selectCubeFace(coord + xoffs) != face ||
				selectCubeFace(coord - xoffs) != face ||
				selectCubeFace(coord + yoffs) != face ||
				selectCubeFace(coord - yoffs) != face)
			{
				return Vec2(bounds.x(), 1000.0f);
			}
		}

		return bounds;
	}
}